

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StreamExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::StreamExpressionWithRangeSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,StreamExpressionWithRangeSyntax **args_1)

{
  StreamExpressionWithRangeSyntax *withRange;
  ExpressionSyntax *in_RDX;
  StreamExpressionSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  withRange = (StreamExpressionWithRangeSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::StreamExpressionSyntax::StreamExpressionSyntax(in_RSI,in_RDX,withRange);
  return (StreamExpressionSyntax *)withRange;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }